

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

compare_eq_result_container<QList<QModelIndex>,_QModelIndex> __thiscall
QList<QModelIndex>::operator==(QList<QModelIndex> *this,QList<QModelIndex> *other)

{
  long lVar1;
  const_iterator __first1;
  const_iterator __first2;
  bool bVar2;
  
  lVar1 = (this->d).size;
  if (lVar1 != (other->d).size) {
    return false;
  }
  __first1.i = (this->d).ptr;
  __first2.i = (other->d).ptr;
  if (__first1.i != __first2.i) {
    bVar2 = std::__equal<false>::
            equal<QList<QModelIndex>::const_iterator,QList<QModelIndex>::const_iterator>
                      (__first1,__first1.i + lVar1,__first2);
    return bVar2;
  }
  return true;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }